

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

void __thiscall FIX::DataDictionary::iterate(DataDictionary *this,FieldMap *map,MsgType *msgType)

{
  RepeatedTag *this_00;
  bool bVar1;
  int field;
  pointer field_00;
  allocator<char> local_49;
  string local_48;
  
  field_00 = (map->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
             _M_impl.super__Vector_impl_data._M_start;
  field = 0;
  while( true ) {
    if (field_00 ==
        (map->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    if ((field_00 !=
         (map->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl
         .super__Vector_impl_data._M_start) && (field_00->m_tag == field)) break;
    checkHasValue(this,field_00);
    if (this->m_hasVersion == true) {
      checkValidFormat(this,field_00);
      checkValue(this,field_00);
    }
    if ((((this->m_beginString).super_StringField.super_FieldBase.m_string._M_string_length != 0) &&
        (bVar1 = field_00->m_tag < 5000, (this->m_allowUnknownMessageFields & bVar1) == 0)) &&
       (bVar1 || (this->m_checkUserDefinedFields & 1U) != 0)) {
      checkValidTagNumber(this,field_00);
      bVar1 = Message::isHeaderField(field_00,this);
      if (!bVar1) {
        bVar1 = Message::isTrailerField(field_00,this);
        if (!bVar1) {
          checkIsInMessage(this,field_00,msgType);
          checkGroupCount(this,field_00,map,msgType);
        }
      }
    }
    field = field_00->m_tag;
    field_00 = field_00 + 1;
  }
  this_00 = (RepeatedTag *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  RepeatedTag::RepeatedTag(this_00,field,&local_48);
  __cxa_throw(this_00,&RepeatedTag::typeinfo,Exception::~Exception);
}

Assistant:

void DataDictionary::iterate(const FieldMap &map, const MsgType &msgType) const {
  int lastField = 0;

  FieldMap::const_iterator i;
  for (i = map.begin(); i != map.end(); ++i) {
    const FieldBase &field = (*i);
    if (i != map.begin() && (field.getTag() == lastField)) {
      throw RepeatedTag(lastField);
    }
    checkHasValue(field);

    if (m_hasVersion) {
      checkValidFormat(field);
      checkValue(field);
    }

    if (m_beginString.getValue().length() && shouldCheckTag(field)) {
      checkValidTagNumber(field);
      if (!Message::isHeaderField(field, this) && !Message::isTrailerField(field, this)) {
        checkIsInMessage(field, msgType);
        checkGroupCount(field, map, msgType);
      }
    }
    lastField = field.getTag();
  }
}